

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

BaseExc * __thiscall Iex_2_5::BaseExc::operator=(BaseExc *this,BaseExc *be)

{
  if (this != be) {
    std::__cxx11::string::_M_assign((string *)&this->_message);
    std::__cxx11::string::_M_assign((string *)&this->_stackTrace);
  }
  return this;
}

Assistant:

BaseExc &
BaseExc::operator = (const BaseExc& be) throw ()
{
    if (this != &be)
    {
        _message = be._message;
        _stackTrace = be._stackTrace;
    }

    return *this;
}